

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Session.cpp
# Opt level: O2

void __thiscall FIX::Session::generateLogon(Session *this,Message *aLogon)

{
  Message *message;
  allocator<char> local_159;
  STRING local_158;
  FieldBase local_138;
  EncryptMethod encryptMethod;
  HeartBtInt heartBtInt;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&encryptMethod,"A",(allocator<char> *)&heartBtInt);
  message = newMessage(this,(string *)&encryptMethod);
  std::__cxx11::string::~string((string *)&encryptMethod);
  EncryptMethod::EncryptMethod(&encryptMethod);
  HeartBtInt::HeartBtInt(&heartBtInt);
  local_158._M_dataplus._M_p._0_4_ = 0;
  EncryptMethod::EncryptMethod((EncryptMethod *)&local_138,(INT *)&local_158);
  FieldMap::setField(&message->super_FieldMap,&local_138,true);
  FieldBase::~FieldBase(&local_138);
  if ((this->m_sessionID).m_isFIXT == true) {
    DefaultApplVerID::DefaultApplVerID
              ((DefaultApplVerID *)&local_138,&this->m_senderDefaultApplVerID);
    FieldMap::setField(&message->super_FieldMap,&local_138,true);
    FieldBase::~FieldBase(&local_138);
  }
  if ((this->m_state).m_receivedReset == true) {
    local_158._M_dataplus._M_p._0_4_ = CONCAT31(local_158._M_dataplus._M_p._1_3_,1);
    ResetSeqNumFlag::ResetSeqNumFlag((ResetSeqNumFlag *)&local_138,(BOOLEAN *)&local_158);
    FieldMap::setField(&message->super_FieldMap,&local_138,true);
    FieldBase::~FieldBase(&local_138);
  }
  FieldMap::getField(&aLogon->super_FieldMap,(FieldBase *)&heartBtInt);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_158,"A",&local_159);
  MsgType::MsgType((MsgType *)&local_138,&local_158);
  FieldMap::setField(&(message->m_header).super_FieldMap,&local_138,true);
  FieldBase::~FieldBase(&local_138);
  std::__cxx11::string::~string((string *)&local_158);
  FieldMap::setField(&message->super_FieldMap,(FieldBase *)&heartBtInt,true);
  fill(this,&message->m_header);
  sendRaw(this,message,0);
  (this->m_state).m_sentLogon = true;
  FieldBase::~FieldBase((FieldBase *)&heartBtInt);
  FieldBase::~FieldBase((FieldBase *)&encryptMethod);
  (*(message->super_FieldMap)._vptr_FieldMap[1])(message);
  return;
}

Assistant:

void Session::generateLogon( const Message& aLogon )
{
  SmartPtr<Message> pMsg(newMessage("A"));
  Message & logon = *pMsg;

  EncryptMethod encryptMethod;
  HeartBtInt heartBtInt;
  logon.setField( EncryptMethod( 0 ) );
  if( m_sessionID.isFIXT() )
    logon.setField( DefaultApplVerID(m_senderDefaultApplVerID) );  
  if( m_state.receivedReset() )
    logon.setField( ResetSeqNumFlag(true) );
  aLogon.getField( heartBtInt );
  logon.getHeader().setField( MsgType( "A" ) );
  logon.setField( heartBtInt );
  fill( logon.getHeader() );
  sendRaw( logon );
  m_state.sentLogon( true );
}